

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReflectionClassGenerator *this_00;
  ulong uVar2;
  undefined7 in_register_00000009;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *descriptor_00;
  EnumDescriptor *extraout_RDX_03;
  EnumDescriptor *extraout_RDX_04;
  EnumDescriptor *descriptor_01;
  EnumDescriptor *extraout_RDX_05;
  EnumDescriptor *extraout_RDX_06;
  int i;
  long lVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Printer *local_48;
  undefined4 local_3c;
  ReflectionClassGenerator *local_38;
  
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x6b) != '\x01') {
    local_3c = (undefined4)CONCAT71(in_register_00000009,last);
    local_38 = this;
    GetClassName_abi_cxx11_(&local_88,(csharp *)descriptor,(Descriptor *)printer);
    io::Printer::Print(printer,
                       "new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
                       "type_name",&local_88);
    paVar1 = &local_88.field_2;
    descriptor_00 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
      descriptor_00 = extraout_RDX_00;
    }
    local_48 = printer;
    if (*(int *)(descriptor + 0x2c) < 1) {
      io::Printer::Print(printer,"null, ");
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar5 = 0;
      lVar3 = 0;
      do {
        GetPropertyName_abi_cxx11_
                  (&local_88,(csharp *)(*(long *)(descriptor + 0x30) + lVar5),descriptor_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   &local_88);
        descriptor_00 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
          descriptor_00 = extraout_RDX_02;
        }
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0xa8;
      } while (lVar3 < *(int *)(descriptor + 0x2c));
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)paVar1;
      JoinStrings(&local_68,"\", \"",&local_88);
      printer = local_48;
      io::Printer::Print(local_48,"new[]{ \"$fields$\" }, ","fields",&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    if (*(int *)(descriptor + 0x38) < 1) {
      io::Printer::Print(printer,"null, ");
      descriptor_01 = extraout_RDX_04;
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar5 = 0;
      lVar3 = 0;
      do {
        UnderscoresToCamelCase
                  (&local_88,*(string **)(*(long *)(descriptor + 0x40) + lVar5),true,false);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   &local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
        }
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x30;
      } while (lVar3 < *(int *)(descriptor + 0x38));
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)paVar1;
      JoinStrings(&local_68,"\", \"",&local_88);
      printer = local_48;
      io::Printer::Print(local_48,"new[]{ \"$oneofs$\" }, ","oneofs",&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      descriptor_01 = extraout_RDX_03;
    }
    if (*(int *)(descriptor + 0x58) < 1) {
      io::Printer::Print(printer,"null, ");
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar5 = 0;
      lVar3 = 0;
      do {
        GetClassName_abi_cxx11_
                  (&local_88,(csharp *)(*(long *)(descriptor + 0x60) + lVar5),descriptor_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   &local_88);
        descriptor_01 = extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
          descriptor_01 = extraout_RDX_06;
        }
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x38;
      } while (lVar3 < *(int *)(descriptor + 0x58));
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)paVar1;
      JoinStrings(&local_68,"), typeof(",&local_88);
      printer = local_48;
      io::Printer::Print(local_48,"new[]{ typeof($enums$) }, ","enums",&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    this_00 = local_38;
    if (*(int *)(descriptor + 0x48) < 1) {
      pcVar4 = "null";
    }
    else {
      io::Printer::Print(printer,"new pbr::GeneratedClrTypeInfo[] { ");
      uVar2 = (ulong)*(uint *)(descriptor + 0x48);
      pcVar4 = "}";
      if (0 < (int)*(uint *)(descriptor + 0x48)) {
        lVar3 = 0;
        uVar6 = 0;
        do {
          WriteGeneratedCodeInfo
                    (this_00,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar3),printer,
                     uVar6 == (int)uVar2 - 1);
          uVar6 = uVar6 + 1;
          uVar2 = (ulong)*(int *)(descriptor + 0x48);
          lVar3 = lVar3 + 0xa8;
        } while ((long)uVar6 < (long)uVar2);
      }
    }
    io::Printer::Print(printer,pcVar4);
    pcVar4 = "),\n";
    if ((char)local_3c != '\0') {
      pcVar4 = ")";
    }
    io::Printer::Print(printer,pcVar4);
    return;
  }
  io::Printer::Print(printer,"null, ");
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));
  
  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", JoinStrings(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", JoinStrings(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", JoinStrings(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null. 
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}